

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateStructArgs
          (SwiftGenerator *this,StructDef *struct_def,string *code_ptr,string *nameprefix,
          string *object_name,string *obj_api_named,bool is_obj_api)

{
  IdlNamer *pIVar1;
  FieldDef *field;
  StructDef *struct_def_00;
  string *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer ppFVar2;
  string type;
  string field_field;
  string field_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppFVar2 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = &this->namer_;
  do {
    if (ppFVar2 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    field = *ppFVar2;
    if (field->deprecated == false) {
      if (((field->value).type.base_type == BASE_TYPE_STRUCT) &&
         (struct_def_00 = (field->value).type.struct_def, struct_def_00->fixed == true)) {
        std::operator+(&local_50,nameprefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
        std::operator+(&local_150,object_name,".");
        std::operator+(&local_d0,&local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
        GenerateStructArgs(this,struct_def_00,code_ptr,&local_50,&local_d0,obj_api_named,is_obj_api)
        ;
        std::__cxx11::string::~string((string *)&local_d0);
        this_00 = &local_150;
      }
      else {
        (*(pIVar1->super_Namer)._vptr_Namer[7])(&local_50,pIVar1,field);
        (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_d0,pIVar1,field);
        GenType_abi_cxx11_(&local_150,this,&(field->value).type,false);
        if (is_obj_api) {
          std::operator+(&local_b0,nameprefix,&local_50);
          std::operator+(&local_90,&local_b0,": ");
          std::operator+(&local_70,&local_90,obj_api_named);
          std::operator+(&local_130,&local_70,object_name);
          std::operator+(&local_110,&local_130,".");
          std::operator+(&local_f0,&local_110,&local_d0);
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          __return_storage_ptr__ = &local_b0;
LAB_002203a4:
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
        }
        else {
          std::operator+(&local_130,nameprefix,&local_50);
          std::operator+(&local_110,&local_130,": ");
          std::operator+(&local_f0,&local_110,&local_150);
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          if (((field->value).type.enum_def == (EnumDef *)0x0) ||
             (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
            std::__cxx11::string::append((char *)code_ptr);
            __return_storage_ptr__ = &local_f0;
            SwiftConstant_abi_cxx11_(__return_storage_ptr__,this,field);
            std::__cxx11::string::append((string *)code_ptr);
            goto LAB_002203a4;
          }
        }
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::~string((string *)&local_150);
        this_00 = &local_d0;
      }
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::string::~string((string *)&local_50);
    }
    ppFVar2 = ppFVar2 + 1;
  } while( true );
}

Assistant:

void GenerateStructArgs(const StructDef &struct_def, std::string *code_ptr,
                          const std::string &nameprefix,
                          const std::string &object_name,
                          const std::string &obj_api_named = "",
                          bool is_obj_api = false) {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto &field_type = field.value.type;
      if (IsStruct(field.value.type)) {
        GenerateStructArgs(
            *field_type.struct_def, code_ptr, (nameprefix + field.name),
            (object_name + "." + field.name), obj_api_named, is_obj_api);
      } else {
        const auto field_var = namer_.Variable(field);
        const auto field_field = namer_.Field(field);
        const auto type = GenType(field.value.type);
        if (!is_obj_api) {
          code += nameprefix + field_var + ": " + type;
          if (!IsEnum(field.value.type)) {
            code += " = ";
            code += SwiftConstant(field);
          }
          code += ", ";
          continue;
        }
        code += nameprefix + field_var + ": " + obj_api_named + object_name +
                "." + field_field;
        code += ", ";
      }
    }
  }